

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O1

void __thiscall Matrix3f::print(Matrix3f *this)

{
  printf("[ %.4f %.4f %.4f ]\n[ %.4f %.4f %.4f ]\n[ %.4f %.4f %.4f ]\n",(double)this->m_elements[0],
         (double)this->m_elements[3],(double)this->m_elements[6],(double)this->m_elements[1],
         (double)this->m_elements[4],(double)this->m_elements[7],(double)this->m_elements[2],
         (double)this->m_elements[5]);
  return;
}

Assistant:

void Matrix3f::print()
{
	printf( "[ %.4f %.4f %.4f ]\n[ %.4f %.4f %.4f ]\n[ %.4f %.4f %.4f ]\n",
		m_elements[ 0 ], m_elements[ 3 ], m_elements[ 6 ],
		m_elements[ 1 ], m_elements[ 4 ], m_elements[ 7 ],
		m_elements[ 2 ], m_elements[ 5 ], m_elements[ 8 ] );
}